

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

char * __thiscall
CoreML::Specification::ArrayFeatureType::_InternalParse
          (ArrayFeatureType *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  ParseContext *this_00;
  bool bVar1;
  uint32_t value;
  RepeatedField<long> *object;
  uint64_t uVar2;
  ArrayFeatureType_EnumeratedShapes *msg;
  ArrayFeatureType_ShapeRange *msg_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  float value_00;
  double value_01;
  uint64_t val;
  ParseContext *pPStack_20;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  ArrayFeatureType *this_local;
  
  pPStack_20 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
LAB_0023fe4c:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(pPStack_20,(char **)&ctx_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return (char *)ctx_local;
    }
    ctx_local = (ParseContext *)
                google::protobuf::internal::ReadTag
                          ((char *)ctx_local,(uint32_t *)((long)&val + 4),0);
    this_00 = pPStack_20;
    tag_00 = val._4_4_;
    switch(val._4_4_ >> 3) {
    case 1:
      if ((val._4_4_ & 0xff) == 10) {
        object = _internal_mutable_shape(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::PackedInt64Parser
                              (object,(char *)ctx_local,pPStack_20);
      }
      else {
        if ((val._4_4_ & 0xff) != 8) goto LAB_002400b9;
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
        _internal_add_shape(this,uVar2);
      }
      break;
    case 2:
      if ((val._4_4_ & 0xff) != 0x10) goto LAB_002400b9;
      uVar2 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)0x0;
      }
      _internal_set_datatype(this,(ArrayFeatureType_ArrayDataType)uVar2);
      goto LAB_0023fe4c;
    default:
      goto LAB_002400b9;
    case 0x15:
      if ((val._4_4_ & 0xff) != 0xaa) goto LAB_002400b9;
      msg = _internal_mutable_enumeratedshapes(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::ParseContext::ParseMessage
                            (this_00,&msg->super_MessageLite,(char *)ctx_local);
      break;
    case 0x1f:
      if ((val._4_4_ & 0xff) != 0xfa) goto LAB_002400b9;
      msg_00 = _internal_mutable_shaperange(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::ParseContext::ParseMessage
                            (this_00,&msg_00->super_MessageLite,(char *)ctx_local);
      break;
    case 0x29:
      if ((val._4_4_ & 0xff) != 0x48) goto LAB_002400b9;
      value = google::protobuf::internal::ReadVarint32((char **)&ctx_local);
      _internal_set_intdefaultvalue(this,value);
      break;
    case 0x33:
      if ((val._4_4_ & 0xff) != 0x9d) goto LAB_002400b9;
      value_00 = google::protobuf::internal::UnalignedLoad<float>((char *)ctx_local);
      _internal_set_floatdefaultvalue(this,value_00);
      ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 4);
      goto LAB_0023fe4c;
    case 0x3d:
      if ((val._4_4_ & 0xff) == 0xe9) {
        value_01 = google::protobuf::internal::UnalignedLoad<double>((char *)ctx_local);
        _internal_set_doubledefaultvalue(this,value_01);
        ctx_local = (ParseContext *)&(ctx_local->super_EpsCopyInputStream).buffer_end_;
        goto LAB_0023fe4c;
      }
LAB_002400b9:
      if ((val._4_4_ == 0) || ((val._4_4_ & 7) == 4)) {
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)0x0;
        }
        google::protobuf::internal::EpsCopyInputStream::SetLastTag
                  (&pPStack_20->super_EpsCopyInputStream,val._4_4_);
        return (char *)ctx_local;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>
                          (&(this->super_MessageLite)._internal_metadata_);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::UnknownFieldParse
                            (tag_00,unknown,(char *)ctx_local,pPStack_20);
    }
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* ArrayFeatureType::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated int64 shape = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt64Parser(_internal_mutable_shape(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 8) {
          _internal_add_shape(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.ArrayFeatureType.ArrayDataType dataType = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_datatype(static_cast<::CoreML::Specification::ArrayFeatureType_ArrayDataType>(val));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.ArrayFeatureType.EnumeratedShapes enumeratedShapes = 21;
      case 21:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 170)) {
          ptr = ctx->ParseMessage(_internal_mutable_enumeratedshapes(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.ArrayFeatureType.ShapeRange shapeRange = 31;
      case 31:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 250)) {
          ptr = ctx->ParseMessage(_internal_mutable_shaperange(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 intDefaultValue = 41;
      case 41:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 72)) {
          _internal_set_intdefaultvalue(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // float floatDefaultValue = 51;
      case 51:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 157)) {
          _internal_set_floatdefaultvalue(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr));
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      // double doubleDefaultValue = 61;
      case 61:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 233)) {
          _internal_set_doubledefaultvalue(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}